

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_MRIStepInnerEvolve(MRIStepInnerStepper stepper,realtype t0,realtype tout,N_Vector y)

{
  void *in_RSI;
  int retval;
  int nforcing;
  N_Vector *forcing;
  realtype tscale;
  realtype tshift;
  realtype tret;
  void *arkode_mem;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  N_Vector **in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  N_Vector *in_stack_ffffffffffffffc0;
  MRIStepInnerStepper in_stack_ffffffffffffffc8;
  realtype in_stack_ffffffffffffffd0;
  int local_4;
  
  local_4 = MRIStepInnerStepper_GetContent
                      ((MRIStepInnerStepper)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (void **)0xe8f199);
  if ((((local_4 == 0) &&
       (local_4 = MRIStepInnerStepper_GetForcingData
                            (in_stack_ffffffffffffffc8,(realtype *)in_stack_ffffffffffffffc0,
                             (realtype *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             in_stack_ffffffffffffffb0,
                             (int *)((ulong)in_stack_ffffffffffffffac << 0x20)), local_4 == 0)) &&
      (local_4 = arkStep_SetInnerForcing
                           (in_RSI,in_stack_ffffffffffffffd0,(realtype)in_stack_ffffffffffffffc8,
                            in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc), local_4 == 0)) &&
     (((local_4 = ARKStepSetStopTime(in_stack_ffffffffffffffb0,
                                     (realtype)((ulong)in_stack_ffffffffffffffac << 0x20)),
       local_4 == 0 &&
       (local_4 = ARKStepEvolve(in_stack_ffffffffffffffc8,(realtype)in_stack_ffffffffffffffc0,
                                (N_Vector)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                (realtype *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac),
       -1 < local_4)) &&
      (local_4 = arkStep_SetInnerForcing
                           (in_RSI,in_stack_ffffffffffffffd0,(realtype)in_stack_ffffffffffffffc8,
                            in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc), local_4 == 0)))) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_MRIStepInnerEvolve(MRIStepInnerStepper stepper, realtype t0,
                               realtype tout, N_Vector y)
{
  void*    arkode_mem;     /* arkode memory             */
  realtype tret;           /* return time               */
  realtype tshift, tscale; /* time normalization values */
  N_Vector *forcing;       /* forcing vectors           */
  int      nforcing;       /* number of forcing vectors */
  int      retval;         /* return value              */

  /* extract the ARKODE memory struct */
  retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* get the forcing data */
  retval = MRIStepInnerStepper_GetForcingData(stepper,
                                              &tshift, &tscale,
                                              &forcing, &nforcing);
  if (retval != ARK_SUCCESS) return(retval);

  /* set the inner forcing data */
  retval = arkStep_SetInnerForcing(arkode_mem, tshift, tscale,
                                   forcing, nforcing);
  if (retval != ARK_SUCCESS) return(retval);

  /* set the stop time */
  retval = ARKStepSetStopTime(arkode_mem, tout);
  if (retval != ARK_SUCCESS) return(retval);

  /* evolve inner ODE */
  retval = ARKStepEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);
  if (retval < 0) return(retval);

  /* disable inner forcing */
  retval = arkStep_SetInnerForcing(arkode_mem, ZERO, ONE, NULL, 0);
  if (retval != ARK_SUCCESS) return(retval);

  return(ARK_SUCCESS);
}